

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O3

RegSlot __thiscall Js::AsmJsFunc::GetConstRegister<int>(AsmJsFunc *this,int val)

{
  Types type;
  uint uVar1;
  RegisterSpace *pRVar2;
  long lVar3;
  uint uVar4;
  RegSlot *pRVar6;
  ulong uVar5;
  
  type = WAsmJs::FromPrimitiveType<int>();
  pRVar2 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,type);
  lVar3 = *(long *)&pRVar2[1].mFirstTmpReg;
  uVar1 = 0;
  if (lVar3 != 0) {
    uVar1 = JsUtil::
            BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(val * 2 + 1,pRVar2[2].mNbConst,pRVar2[3].mNextLocation);
    uVar4 = *(uint *)(lVar3 + (ulong)uVar1 * 4);
    uVar1 = 0;
    if (-1 < (int)uVar4) {
      lVar3 = *(long *)&pRVar2[1].mNbConst;
      uVar1 = 0;
      do {
        uVar5 = (ulong)uVar4;
        if (*(int *)(lVar3 + 8 + uVar5 * 0xc) == val) {
          if (*(DictionaryStats **)&pRVar2[3].mNbConst != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)&pRVar2[3].mNbConst,uVar1);
            lVar3._0_4_ = pRVar2[1].mNbConst;
            lVar3._4_4_ = pRVar2[1].mType;
          }
          pRVar6 = (RegSlot *)(lVar3 + uVar5 * 0xc);
          goto LAB_0093ca26;
        }
        uVar1 = uVar1 + 1;
        uVar4 = *(uint *)(lVar3 + uVar5 * 0xc + 4);
      } while (-1 < (int)uVar4);
    }
  }
  pRVar6 = &Constants::NoRegister;
  if (*(DictionaryStats **)&pRVar2[3].mNbConst != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)&pRVar2[3].mNbConst,uVar1);
  }
LAB_0093ca26:
  return *pRVar6;
}

Assistant:

inline void AddConst             ( T val ){GetRegisterSpace<T>().AddConst( val );}